

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIListBox::draw(CGUIListBox *this)

{
  uint uVar1;
  IGUIScrollBar *pIVar2;
  IGUISpriteBank *pIVar3;
  pointer pLVar4;
  IGUIFont *pIVar5;
  vector2d<int> vVar6;
  byte bVar7;
  char cVar8;
  s32 size;
  int iVar9;
  undefined4 uVar10;
  u32 uVar11;
  uint uVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  rect<int> clientClip;
  rect<int> *other;
  undefined4 local_9c;
  rect<int> frameRect;
  rect<int> local_78;
  rect<int> textRect;
  string<wchar_t> local_50;
  
  if (this->field_0xa0 == '\x01') {
    recalculateItemHeight(this);
    plVar13 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    size = (**(code **)(*plVar13 + 0x10))(plVar13,0);
    updateScrollBarSize(this,size);
    frameRect.UpperLeftCorner.X = *(int *)&this->field_0x40;
    frameRect.UpperLeftCorner.Y = *(int *)&this->field_0x44;
    frameRect.LowerRightCorner.X = *(int *)&this->field_0x48;
    frameRect.LowerRightCorner.Y = *(int *)&this->field_0x4c;
    local_78.LowerRightCorner.X = *(int *)&this->field_0x48;
    local_78.LowerRightCorner.Y = *(int *)&this->field_0x4c;
    local_78.UpperLeftCorner.X = (int)*(undefined8 *)&this->field_0x40 + 1;
    local_78.UpperLeftCorner.Y = (int)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20) + 1;
    iVar9 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xd])()
    ;
    if ((char)iVar9 != '\0') {
      local_78.LowerRightCorner.X =
           local_78.LowerRightCorner.X +
           ((this->ScrollBar->super_IGUIElement).RelativeRect.UpperLeftCorner.X -
           (this->ScrollBar->super_IGUIElement).RelativeRect.LowerRightCorner.X);
    }
    local_78.LowerRightCorner.Y = local_78.LowerRightCorner.Y + -1;
    other = (rect<int> *)&this->field_0x50;
    core::rect<int>::clipAgainst(&local_78,other);
    uVar10 = (**(code **)*plVar13)(plVar13,3);
    (**(code **)(*plVar13 + 0x70))(plVar13,this,uVar10,1,this->DrawBack,&frameRect,other);
    frameRect.LowerRightCorner.X = *(int *)&this->field_0x48;
    frameRect.LowerRightCorner.Y = *(int *)&this->field_0x4c;
    frameRect.UpperLeftCorner.X = (int)*(undefined8 *)&this->field_0x40;
    frameRect.UpperLeftCorner.Y = (int)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20);
    frameRect.UpperLeftCorner.X = frameRect.UpperLeftCorner.X + 1;
    iVar9 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xd])()
    ;
    pIVar2 = this->ScrollBar;
    if ((char)iVar9 != '\0') {
      frameRect.LowerRightCorner.Y = 0;
      frameRect.LowerRightCorner.X =
           frameRect.LowerRightCorner.X +
           ((pIVar2->super_IGUIElement).RelativeRect.UpperLeftCorner.X -
           (pIVar2->super_IGUIElement).RelativeRect.LowerRightCorner.X);
    }
    frameRect.LowerRightCorner.Y = this->ItemHeight + *(int *)&this->field_0x44;
    iVar9 = (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])();
    frameRect.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - iVar9;
    iVar9 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
                      ();
    frameRect.LowerRightCorner.Y = frameRect.LowerRightCorner.Y - iVar9;
    if (this->HighlightWhenNotFocused == false) {
      bVar7 = 0;
      cVar8 = (**(code **)(**(long **)&this->field_0x128 + 0x28))
                        (*(long **)&this->field_0x128,this,0);
      if (cVar8 == '\0') {
        bVar7 = (**(code **)(**(long **)&this->field_0x128 + 0x28))
                          (*(long **)&this->field_0x128,this->ScrollBar,0);
        bVar7 = bVar7 ^ 1;
      }
    }
    else {
      bVar7 = 0;
    }
    lVar15 = 0;
    for (uVar16 = 0;
        lVar14 = (long)(this->Items).m_data.
                       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->Items).m_data.
                       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                       ._M_impl.super__Vector_impl_data._M_start,
        (long)uVar16 < (long)(int)(lVar14 / 0x48); uVar16 = uVar16 + 1) {
      if ((*(int *)&this->field_0x44 <= frameRect.LowerRightCorner.Y) &&
         (frameRect.UpperLeftCorner.Y <= *(int *)&this->field_0x4c)) {
        if (uVar16 == (uint)this->Selected && bVar7 == 0) {
          local_50.str._M_dataplus._M_p._0_4_ = (**(code **)*plVar13)(plVar13,10,lVar14 % 0x48);
          (**(code **)(*plVar13 + 0xa8))(plVar13,this,&local_50,&frameRect,&local_78);
        }
        uVar10 = (undefined4)((ulong)other >> 0x20);
        textRect.LowerRightCorner = frameRect.LowerRightCorner;
        vVar6 = textRect.LowerRightCorner;
        textRect.UpperLeftCorner.X = frameRect.UpperLeftCorner.X;
        iVar9 = textRect.UpperLeftCorner.X + 3;
        textRect.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y;
        textRect.UpperLeftCorner.X = iVar9;
        if (this->Font != (IGUIFont *)0x0) {
          pIVar3 = this->IconBank;
          if ((pIVar3 != (IGUISpriteBank *)0x0) &&
             (pLVar4 = (this->Items).m_data.
                       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             -1 < *(int *)((long)(pLVar4->OverrideColors + -1) + lVar15 + 4))) {
            textRect.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;
            local_50.str._M_dataplus._M_p._4_4_ =
                 (textRect.LowerRightCorner.Y - textRect.UpperLeftCorner.Y) / 2 +
                 textRect.UpperLeftCorner.Y;
            local_50.str._M_dataplus._M_p._0_4_ = iVar9 + this->ItemsIconWidth / 2;
            uVar12 = *(uint *)((long)(pLVar4->OverrideColors + -1) + lVar15 + 4);
            textRect.LowerRightCorner = vVar6;
            if (uVar16 == (uint)this->Selected && bVar7 == 0) {
              cVar8 = (**(code **)(*(long *)this + 0x1b0))(this,uVar16 & 0xffffffff,3);
              if (cVar8 == '\0') {
                local_9c = (**(code **)(*(long *)this + 0x1c0))(this,3);
              }
              else {
                local_9c = (**(code **)(*(long *)this + 0x1b8))(this,uVar16 & 0xffffffff,3);
              }
              uVar1 = this->selectTime;
              uVar11 = os::Timer::getTime();
              (*pIVar3->_vptr_IGUISpriteBank[8])
                        (pIVar3,(ulong)uVar12,&local_50,&local_78,&local_9c,(ulong)uVar1,
                         CONCAT44(uVar10,uVar11),0,1);
            }
            else {
              cVar8 = (**(code **)(*(long *)this + 0x1b0))(this,uVar16 & 0xffffffff,2);
              if (cVar8 == '\0') {
                local_9c = (**(code **)(*(long *)this + 0x1c0))(this,2);
              }
              else {
                local_9c = (**(code **)(*(long *)this + 0x1b8))(this,uVar16 & 0xffffffff,2);
              }
              uVar11 = 0;
              if (uVar16 == (uint)this->Selected) {
                uVar11 = os::Timer::getTime();
              }
              (*pIVar3->_vptr_IGUISpriteBank[8])
                        (pIVar3,(ulong)uVar12,&local_50,&local_78,&local_9c,0,
                         CONCAT44(uVar10,uVar11),0,1);
            }
            iVar9 = textRect.UpperLeftCorner.X;
          }
          textRect.UpperLeftCorner.X = iVar9 + this->ItemsIconWidth + 3;
          pIVar5 = this->Font;
          if (uVar16 == (uint)this->Selected && bVar7 == 0) {
            core::string<wchar_t>::string<wchar_t>
                      (&local_50,
                       *(wchar_t **)
                        ((long)((this->Items).m_data.
                                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                ._M_impl.super__Vector_impl_data._M_start)->OverrideColors +
                        lVar15 + -0x24));
            cVar8 = (**(code **)(*(long *)this + 0x1b0))(this,uVar16 & 0xffffffff,1);
            if (cVar8 == '\0') {
              uVar12 = (**(code **)(*(long *)this + 0x1c0))(this,1);
            }
            else {
              uVar12 = (**(code **)(*(long *)this + 0x1b8))(this,uVar16 & 0xffffffff,1);
            }
            other = &local_78;
            (**pIVar5->_vptr_IGUIFont)(pIVar5,&local_50,&textRect,(ulong)uVar12,0,1,other);
            ::std::__cxx11::wstring::_M_dispose();
          }
          else {
            core::string<wchar_t>::string<wchar_t>
                      (&local_50,
                       *(wchar_t **)
                        ((long)((this->Items).m_data.
                                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                ._M_impl.super__Vector_impl_data._M_start)->OverrideColors +
                        lVar15 + -0x24));
            cVar8 = (**(code **)(*(long *)this + 0x1b0))(this,uVar16 & 0xffffffff,0);
            if (cVar8 == '\0') {
              uVar12 = (**(code **)(*(long *)this + 0x1c0))(this,0);
            }
            else {
              uVar12 = (**(code **)(*(long *)this + 0x1b8))(this,uVar16 & 0xffffffff,0);
            }
            other = &local_78;
            (**pIVar5->_vptr_IGUIFont)(pIVar5,&local_50,&textRect,(ulong)uVar12,0,1,other);
            ::std::__cxx11::wstring::_M_dispose();
          }
        }
      }
      frameRect.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y + this->ItemHeight;
      frameRect.LowerRightCorner.Y = frameRect.LowerRightCorner.Y + this->ItemHeight;
      lVar15 = lVar15 + 0x48;
    }
    IGUIElement::draw((IGUIElement *)this);
  }
  return;
}

Assistant:

void CGUIListBox::draw()
{
	if (!IsVisible)
		return;

	recalculateItemHeight(); // if the font changed

	IGUISkin *skin = Environment->getSkin();
	updateScrollBarSize(skin->getSize(EGDS_SCROLLBAR_SIZE));

	core::rect<s32> *clipRect = 0;

	// draw background
	core::rect<s32> frameRect(AbsoluteRect);

	// draw items

	core::rect<s32> clientClip(AbsoluteRect);
	clientClip.UpperLeftCorner.Y += 1;
	clientClip.UpperLeftCorner.X += 1;
	if (ScrollBar->isVisible())
		clientClip.LowerRightCorner.X -= ScrollBar->getRelativePosition().getWidth();
	clientClip.LowerRightCorner.Y -= 1;
	clientClip.clipAgainst(AbsoluteClippingRect);

	skin->draw3DSunkenPane(this, skin->getColor(EGDC_3D_HIGH_LIGHT), true,
			DrawBack, frameRect, &AbsoluteClippingRect);

	if (clipRect)
		clientClip.clipAgainst(*clipRect);

	frameRect = AbsoluteRect;
	frameRect.UpperLeftCorner.X += 1;
	if (ScrollBar->isVisible())
		frameRect.LowerRightCorner.X -= ScrollBar->getRelativePosition().getWidth();

	frameRect.LowerRightCorner.Y = AbsoluteRect.UpperLeftCorner.Y + ItemHeight;

	frameRect.UpperLeftCorner.Y -= ScrollBar->getPos();
	frameRect.LowerRightCorner.Y -= ScrollBar->getPos();

	bool hl = (HighlightWhenNotFocused || Environment->hasFocus(this) || Environment->hasFocus(ScrollBar));

	for (s32 i = 0; i < (s32)Items.size(); ++i) {
		if (frameRect.LowerRightCorner.Y >= AbsoluteRect.UpperLeftCorner.Y &&
				frameRect.UpperLeftCorner.Y <= AbsoluteRect.LowerRightCorner.Y) {
			if (i == Selected && hl)
				skin->draw2DRectangle(this, skin->getColor(EGDC_HIGH_LIGHT), frameRect, &clientClip);

			core::rect<s32> textRect = frameRect;
			textRect.UpperLeftCorner.X += 3;

			if (Font) {
				if (IconBank && (Items[i].Icon > -1)) {
					core::position2di iconPos = textRect.UpperLeftCorner;
					iconPos.Y += textRect.getHeight() / 2;
					iconPos.X += ItemsIconWidth / 2;

					if (i == Selected && hl) {
						IconBank->draw2DSprite((u32)Items[i].Icon, iconPos, &clientClip,
								hasItemOverrideColor(i, EGUI_LBC_ICON_HIGHLIGHT) ? getItemOverrideColor(i, EGUI_LBC_ICON_HIGHLIGHT) : getItemDefaultColor(EGUI_LBC_ICON_HIGHLIGHT),
								selectTime, os::Timer::getTime(), false, true);
					} else {
						IconBank->draw2DSprite((u32)Items[i].Icon, iconPos, &clientClip,
								hasItemOverrideColor(i, EGUI_LBC_ICON) ? getItemOverrideColor(i, EGUI_LBC_ICON) : getItemDefaultColor(EGUI_LBC_ICON),
								0, (i == Selected) ? os::Timer::getTime() : 0, false, true);
					}
				}

				textRect.UpperLeftCorner.X += ItemsIconWidth + 3;

				if (i == Selected && hl) {
					Font->draw(Items[i].Text.c_str(), textRect,
							hasItemOverrideColor(i, EGUI_LBC_TEXT_HIGHLIGHT) ? getItemOverrideColor(i, EGUI_LBC_TEXT_HIGHLIGHT) : getItemDefaultColor(EGUI_LBC_TEXT_HIGHLIGHT),
							false, true, &clientClip);
				} else {
					Font->draw(Items[i].Text.c_str(), textRect,
							hasItemOverrideColor(i, EGUI_LBC_TEXT) ? getItemOverrideColor(i, EGUI_LBC_TEXT) : getItemDefaultColor(EGUI_LBC_TEXT),
							false, true, &clientClip);
				}

				textRect.UpperLeftCorner.X -= ItemsIconWidth + 3;
			}
		}

		frameRect.UpperLeftCorner.Y += ItemHeight;
		frameRect.LowerRightCorner.Y += ItemHeight;
	}

	IGUIElement::draw();
}